

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O2

void __thiscall
glslang::TBuiltIns::add2ndGenerationSamplingImaging
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  TBasicType t;
  bool bVar1;
  ulong uVar2;
  uint7 uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  ulong in_R8;
  uint uVar8;
  int iVar9;
  bool bVar10;
  TSamplerDim d;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  TSampler sampler;
  TString textureTypeName;
  TString typeName;
  ulong uVar7;
  
  iVar5 = 0;
  if (version < 0x136 && profile == EEsProfile) {
    bVar1 = true;
    bVar10 = false;
  }
  else {
    in_R8 = (ulong)(uint)version;
    bVar10 = profile == EEsProfile || 0x8b < version;
    bVar1 = version < 0x82 && profile != EEsProfile;
  }
  bVar6 = version < 0x1c2 || profile == EEsProfile;
  uVar7 = CONCAT71((int7)(in_R8 >> 8),bVar6);
  do {
    if (iVar5 == 2) {
      if (0x1c1 < version && profile != EEsProfile) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "bool sparseTexelsResidentARB(int code);\n");
      }
      return;
    }
    for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
      for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
        if (uVar12 == 0 || uVar8 == 0 && iVar5 == 0) {
          bVar13 = uVar8 == 0;
          bVar14 = profile != EEsProfile;
          uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar6);
          if (((0x135 < version || (bVar14 || bVar13)) && (0x8b < version || (!bVar14 || bVar13)))
             && (bVar14 || (iVar5 == 0 || bVar13))) {
            uVar2 = (ulong)(uVar8 | uVar12);
            iVar9 = 0;
LAB_0037c484:
            if (iVar9 != 2) {
              uVar2 = CONCAT71((int7)(uVar2 >> 8),version < 0x136);
              d = Esd1D;
              do {
                if (d != EsdAttachmentEXT) {
                  if (d == EsdNumDims) goto LAB_0037c78f;
                  bVar13 = d != EsdSubpass;
                  uVar3 = (uint7)(uVar2 >> 8);
                  uVar2 = CONCAT71(uVar3,bVar13);
                  if ((spvVersion->vulkan != 0 || bVar13) &&
                     (uVar2 = (ulong)uVar3 << 8, bVar13 || (uVar12 == 0 && iVar5 == 0) && iVar9 == 0
                     )) {
                    if ((((profile != EEsProfile) || ((d - Esd1D & 0xfffffffb) != 0)) &&
                        (((uVar8 == 0 || (d == EsdSubpass)) || (d == Esd2D)))) &&
                       (!(bool)(~bVar10 & d == EsdBuffer))) {
                      uVar2 = (ulong)uVar3 << 8;
                      if (((uVar8 | uVar12) == 0 && iVar9 == 0 || d != EsdBuffer) &&
                          ((profile != EEsProfile || version >= 0x136) || (iVar9 == 0 || uVar8 == 0)
                          )) {
                        uVar2 = CONCAT71(uVar3,d == Esd3D);
                        if (uVar12 == 0 || d != Esd3D) {
                          uVar2 = CONCAT71(uVar3,d == EsdRect);
                          if ((iVar9 == 0) ||
                             ((d != Esd3D && d != EsdRect) && !(bool)(d == EsdCube & bVar1))) {
                            uVar11 = 0xffffffffffffffff;
                            for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
                              if ((((byte)uVar7 & uVar11 == 2) == 0) &&
                                 (((d != EsdRect || (0x8b < version)) || (lVar4 == 0)))) {
                                uVar2 = CONCAT71((int7)(uVar2 >> 8),uVar11 < 2);
                                if (uVar12 == 0 || uVar11 >= 2) {
                                  t = *(TBasicType *)((long)&DAT_0060f3c0 + lVar4);
                                  if (d == EsdSubpass) {
                                    sampler = (TSampler)
                                              (t & 0xff | (uint)(uVar8 != 0) << 0x12 | 0x1f080700);
                                  }
                                  else if (iVar5 == 0) {
                                    uVar2 = (ulong)(iVar9 != 0);
                                    uVar7 = (ulong)(uVar12 != 0);
                                    TSampler::set(&sampler,t,d,iVar9 != 0,uVar12 != 0,uVar8 != 0);
                                  }
                                  else {
                                    uVar2 = (ulong)(iVar9 != 0);
                                    uVar7 = (ulong)(uVar12 != 0);
                                    TSampler::setImage(&sampler,t,d,iVar9 != 0,uVar12 != 0,
                                                       uVar8 != 0);
                                  }
                                  TSampler::getString_abi_cxx11_(&typeName,&sampler);
                                  if (d == EsdSubpass) {
                                    addSubpassSampling(this,sampler,&typeName,(int)uVar2,
                                                       (EProfile)uVar7);
                                  }
                                  else {
                                    addQueryFunctions(this,sampler,&typeName,version,profile);
                                    if (iVar5 == 0) {
                                      addSamplingFunctions(this,sampler,&typeName,version,profile);
                                      uVar2 = (ulong)(uint)version;
                                      uVar7 = (ulong)profile;
                                      addGatherFunctions(this,sampler,&typeName,version,profile);
                                      if (0 < spvVersion->vulkan) {
                                        uVar2 = (ulong)((uint)sampler & 0x120000);
                                        if (((uint)sampler & 0x120000) == 0x100000) {
                                          sampler = (TSampler)
                                                    ((uint)sampler & 0x8005ffff | 0x1f000000);
                                          TSampler::getString_abi_cxx11_(&textureTypeName,&sampler);
                                          addSamplingFunctions
                                                    (this,sampler,&textureTypeName,version,profile);
                                          uVar2 = (ulong)(uint)version;
                                          uVar7 = (ulong)profile;
                                          addQueryFunctions(this,sampler,&textureTypeName,version,
                                                            profile);
                                        }
                                      }
                                    }
                                    else {
                                      uVar2 = (ulong)(uint)version;
                                      uVar7 = (ulong)profile;
                                      addImageFunctions(this,sampler,&typeName,version,profile);
                                    }
                                  }
                                  uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar6);
                                }
                              }
                              uVar11 = uVar11 + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                d = d + Esd1D;
              } while( true );
            }
          }
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
LAB_0037c78f:
  iVar9 = iVar9 + 1;
  goto LAB_0037c484;
}

Assistant:

void TBuiltIns::add2ndGenerationSamplingImaging(int version, EProfile profile, const SpvVersion& spvVersion)
{
    //
    // In this function proper, enumerate the types, then calls the next set of functions
    // to enumerate all the uses for that type.
    //

    // enumerate all the types
    const TBasicType bTypes[] = { EbtFloat, EbtInt, EbtUint,
         EbtFloat16
    };
    bool skipBuffer = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 140);
    bool skipCubeArrayed = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 130);
    for (int image = 0; image <= 1; ++image) // loop over "bool" image vs sampler
    {
        for (int shadow = 0; shadow <= 1; ++shadow) { // loop over "bool" shadow or not
            for (int ms = 0; ms <= 1; ++ms) // loop over "bool" multisample or not
            {
                if ((ms || image) && shadow)
                    continue;
                if (ms && profile != EEsProfile && version < 140)
                    continue;
                if (ms && image && profile == EEsProfile)
                    continue;
                if (ms && profile == EEsProfile && version < 310)
                    continue;

                for (int arrayed = 0; arrayed <= 1; ++arrayed) { // loop over "bool" arrayed or not
                    for (int dim = Esd1D; dim < EsdNumDims; ++dim) { // 1D, ..., buffer, subpass
                        if (dim == EsdAttachmentEXT)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim != Esd2D && dim != EsdSubpass && ms)
                            continue;
                        if (dim == EsdBuffer && skipBuffer)
                            continue;
                        if (dim == EsdBuffer && (shadow || arrayed || ms))
                            continue;
                        if (ms && arrayed && profile == EEsProfile && version < 310)
                            continue;
                        if (dim == Esd3D && shadow)
                            continue;
                        if (dim == EsdCube && arrayed && skipCubeArrayed)
                            continue;
                        if ((dim == Esd3D || dim == EsdRect) && arrayed)
                            continue;

                        // Loop over the bTypes
                        for (size_t bType = 0; bType < sizeof(bTypes)/sizeof(TBasicType); ++bType) {
                            if (bTypes[bType] == EbtFloat16 && (profile == EEsProfile || version < 450))
                                continue;
                            if (dim == EsdRect && version < 140 && bType > 0)
                                continue;
                            if (shadow && (bTypes[bType] == EbtInt || bTypes[bType] == EbtUint))
                                continue;
                            //
                            // Now, make all the function prototypes for the type we just built...
                            //
                            TSampler sampler;
                            if (dim == EsdSubpass) {
                                sampler.setSubpass(bTypes[bType], ms ? true : false);
                            } else if (dim == EsdAttachmentEXT) {
                                sampler.setAttachmentEXT(bTypes[bType]);
                            } else
                            if (image) {
                                sampler.setImage(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                                  shadow  ? true : false,
                                                                                  ms      ? true : false);
                            } else {
                                sampler.set(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                             shadow  ? true : false,
                                                                             ms      ? true : false);
                            }

                            TString typeName = sampler.getString();

                            if (dim == EsdSubpass) {
                                addSubpassSampling(sampler, typeName, version, profile);
                                continue;
                            }

                            addQueryFunctions(sampler, typeName, version, profile);

                            if (image)
                                addImageFunctions(sampler, typeName, version, profile);
                            else {
                                addSamplingFunctions(sampler, typeName, version, profile);
                                addGatherFunctions(sampler, typeName, version, profile);
                                if (spvVersion.vulkan > 0 && sampler.isCombined() && !sampler.shadow) {
                                    // Base Vulkan allows texelFetch() for
                                    // textureBuffer (i.e. without sampler).
                                    //
                                    // GL_EXT_samplerless_texture_functions
                                    // allows texelFetch() and query functions
                                    // (other than textureQueryLod()) for all
                                    // texture types.
                                    sampler.setTexture(sampler.type, sampler.dim, sampler.arrayed, sampler.shadow,
                                                       sampler.ms);
                                    TString textureTypeName = sampler.getString();
                                    addSamplingFunctions(sampler, textureTypeName, version, profile);
                                    addQueryFunctions(sampler, textureTypeName, version, profile);
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    //
    // sparseTexelsResidentARB()
    //
    if (profile != EEsProfile && version >= 450) {
        commonBuiltins.append("bool sparseTexelsResidentARB(int code);\n");
    }
}